

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

char * getCaller(void)

{
  uint uVar1;
  long lVar2;
  char **backtraceSymbols;
  size_t backtraceArrSize;
  void *backtraceArr [3];
  
  uVar1 = backtrace(&backtraceArrSize,3);
  if (uVar1 < 3) {
    backtraceArr[2] = anon_var_dwarf_17c3;
  }
  else {
    lVar2 = backtrace_symbols(&backtraceArrSize,uVar1);
    backtraceArr[2] = *(void **)(lVar2 + 0x10);
  }
  return (char *)backtraceArr[2];
}

Assistant:

const char* getCaller() {
    void* backtraceArr[3];
    size_t backtraceArrSize;

    // get void*'s for all entries on the stack
    backtraceArrSize = backtrace(backtraceArr, 3);

    if (backtraceArrSize < 3) {
        return "Unknown";
    }

    // get the symbols
    char** backtraceSymbols = backtrace_symbols(backtraceArr, backtraceArrSize);

    // the caller is second in the backtrace
    return backtraceSymbols[2];
}